

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_parser.c
# Opt level: O0

int d_get_start_state(D_ParserTables *parser_tables_gram,char *name)

{
  int iVar1;
  uint local_24;
  int i;
  char *name_local;
  D_ParserTables *parser_tables_gram_local;
  
  local_24 = 0;
  while( true ) {
    if (parser_tables_gram->nsymbols <= local_24) {
      return -1;
    }
    if ((parser_tables_gram->symbols[(int)local_24].kind == 1) &&
       (iVar1 = strcmp(parser_tables_gram->symbols[(int)local_24].name,name), iVar1 == 0)) break;
    local_24 = local_24 + 1;
  }
  return parser_tables_gram->symbols[(int)local_24].start_symbol;
}

Assistant:

int d_get_start_state(D_ParserTables* parser_tables_gram, char *name) {
  int i;
  for (i = 0; i < parser_tables_gram->nsymbols; i++)
    if (parser_tables_gram->symbols[i].kind == D_SYMBOL_NTERM && !strcmp(parser_tables_gram->symbols[i].name, name))
      return parser_tables_gram->symbols[i].start_symbol;
  return -1;
}